

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.h
# Opt level: O1

Ref<anurbs::Line<3L>_> __thiscall
anurbs::Model::add<anurbs::Line<3l>>
          (Model *this,Pointer<anurbs::Line<3L>_> *data,string *attributes)

{
  pointer psVar1;
  Attributes *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  undefined8 *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  Ref<anurbs::Line<3L>_> RVar3;
  undefined1 local_78 [16];
  pointer local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  input_adapter local_58;
  _Any_data local_48;
  code *local_38;
  undefined8 uStack_30;
  
  local_68 = (attributes->_M_dataplus)._M_p;
  local_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)attributes->_M_string_length;
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_60->_M_use_count = local_60->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_60->_M_use_count = local_60->_M_use_count + 1;
    }
  }
  add<anurbs::Line<3l>>(this,data);
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
  }
  psVar1 = (this->m_entries).
           super__Vector_base<std::shared_ptr<anurbs::EntryBase>,_std::allocator<std::shared_ptr<anurbs::EntryBase>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00 = (Attributes *)
            psVar1[3].super___shared_ptr<anurbs::EntryBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            psVar1[4].super___shared_ptr<anurbs::EntryBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  nlohmann::detail::input_adapter::
  input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
            (&local_58,(char *)*in_RCX,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )((char *)*in_RCX + in_RCX[1]));
  local_38 = (code *)0x0;
  uStack_30 = 0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  nlohmann::
  basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::parse((basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           *)local_78,&local_58,(parser_callback_t *)&local_48,true);
  Attributes::
  load<anurbs::Model,nlohmann::basic_json<anurbs::FiFoMap,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
            (this_00,(Model *)data,
             (basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)local_78);
  nlohmann::
  basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_78);
  nlohmann::
  basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_78 + 8),local_78[0]);
  _Var2._M_pi = extraout_RDX;
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
    _Var2._M_pi = extraout_RDX_00;
  }
  if (local_58.ia.
      super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.ia.
               super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
    _Var2._M_pi = extraout_RDX_01;
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    _Var2._M_pi = extraout_RDX_02;
  }
  RVar3.m_entry.super___shared_ptr<anurbs::Entry<anurbs::Line<3L>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  RVar3.m_entry.super___shared_ptr<anurbs::Entry<anurbs::Line<3L>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (Ref<anurbs::Line<3L>_>)
         RVar3.m_entry.
         super___shared_ptr<anurbs::Entry<anurbs::Line<3L>_>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ref<TData> add(Pointer<TData> data, const std::string& attributes)
    {
        const auto ref = add(data);

        ref.attributes()->load(*this, Json::parse(attributes));

        return ref;
    }